

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::unspectate(clientinfo *ci)

{
  bool bVar1;
  
  (ci->state).super_fpsstate.health = 100;
  (ci->state).super_fpsstate.maxhealth = 100;
  (ci->state).super_fpsstate.armour = 0;
  (ci->state).super_fpsstate.armourtype = 0;
  (ci->state).super_fpsstate.quadmillis = 0;
  (ci->state).super_fpsstate.gunselect = 6;
  (ci->state).super_fpsstate.gunwait = 0;
  (ci->state).super_fpsstate.ammo[0] = 0;
  (ci->state).super_fpsstate.ammo[1] = 0;
  (ci->state).super_fpsstate.ammo[2] = 0;
  (ci->state).super_fpsstate.ammo[3] = 0;
  (ci->state).super_fpsstate.ammo[4] = 0;
  (ci->state).super_fpsstate.ammo[5] = 0;
  (ci->state).super_fpsstate.ammo[6] = 0;
  (ci->state).super_fpsstate.ammo[7] = 0;
  (ci->state).super_fpsstate.ammo[8] = 0;
  (ci->state).super_fpsstate.ammo[9] = 0;
  (ci->state).super_fpsstate.ammo[10] = 0;
  (ci->state).super_fpsstate.ammo[0xb] = 0;
  (ci->state).super_fpsstate.ammo[0] = 1;
  (ci->state).o.field_0.field_0.x = -1e+10;
  (ci->state).o.field_0.field_0.y = -1e+10;
  (ci->state).o.field_0.field_0.z = -1e+10;
  (ci->state).state = 1;
  (ci->state).deadflush = 0;
  (ci->state).lastspawn = -1;
  (ci->state).lastshot = 0;
  (ci->state).tokens = 0;
  (ci->state).lasttimeplayed = lastmillis;
  if ((ci->state).super_fpsstate.aitype == 0) {
    aiman::dorefresh = 1;
  }
  sendf(-1,1,"ri3",0x3e,(ulong)(uint)ci->clientnum,0);
  bVar1 = hasmap(ci);
  if (bVar1) {
    return;
  }
  rotatemap(true);
  return;
}

Assistant:

extern void unspectate(clientinfo *ci)
    {
        ci->state.state = CS_DEAD;
        ci->state.respawn();
        ci->state.lasttimeplayed = lastmillis;
        aiman::addclient(ci);
        sendf(-1, 1, "ri3", N_SPECTATOR, ci->clientnum, 0);
        if(!hasmap(ci)) rotatemap(true);
        //should checkmaps
    }